

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O3

void helper_crypto_aese_arm(void *vd,void *vm,uint32_t decrypt)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  long lVar3;
  uint local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  uint local_18;
  uint uStack_14;
  uint uStack_10;
  uint uStack_c;
  
  local_28 = *vd;
  uStack_24 = *(uint *)((long)vd + 4);
  uStack_20 = *(uint *)((long)vd + 8);
  uStack_1c = *(uint *)((long)vd + 0xc);
  if (decrypt < 2) {
    local_18 = local_28 ^ *vm;
    uStack_14 = uStack_24 ^ *(uint *)((long)vm + 4);
    uStack_10 = uStack_20 ^ *(uint *)((long)vm + 8);
    uStack_c = uStack_1c ^ *(uint *)((long)vm + 0xc);
    puVar1 = helper_crypto_aese_arm::sbox[decrypt];
    puVar2 = helper_crypto_aese_arm::shift[decrypt];
    lVar3 = 0;
    do {
      *(uint8_t *)((long)&local_28 + lVar3) =
           puVar1[*(byte *)((long)&local_18 + (ulong)puVar2[lVar3])];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    *(ulong *)vd = CONCAT44(uStack_24,local_28);
    *(ulong *)((long)vd + 8) = CONCAT44(uStack_1c,uStack_20);
    return;
  }
  __assert_fail("decrypt < 2",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                ,0x2a,"void helper_crypto_aese_arm(void *, void *, uint32_t)");
}

Assistant:

void HELPER(crypto_aese)(void *vd, void *vm, uint32_t decrypt)
{
    static uint8_t const * const sbox[2] = { AES_sbox, AES_isbox };
    static uint8_t const * const shift[2] = { AES_shifts, AES_ishifts };
    uint64_t *rd = vd;
    uint64_t *rm = vm;
    union CRYPTO_STATE rk = { .l = { rm[0], rm[1] } };
    union CRYPTO_STATE st = { .l = { rd[0], rd[1] } };
    int i;

    assert(decrypt < 2);

    /* xor state vector with round key */
    rk.l[0] ^= st.l[0];
    rk.l[1] ^= st.l[1];

    /* combine ShiftRows operation and sbox substitution */
    for (i = 0; i < 16; i++) {
        CR_ST_BYTE(st, i) = sbox[decrypt][CR_ST_BYTE(rk, shift[decrypt][i])];
    }

    rd[0] = st.l[0];
    rd[1] = st.l[1];
}